

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmGeneratorTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *psVar6;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  MessageType t;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  ostringstream e;
  
  pcVar1 = dependee_name->Target;
  if (pcVar1 != (cmGeneratorTarget *)0x0 || linking) {
    if (linking && pcVar1 != (cmGeneratorTarget *)0x0) {
      TVar3 = cmGeneratorTarget::GetType(pcVar1);
      if ((TVar3 == EXECUTABLE) &&
         (bVar2 = cmGeneratorTarget::IsExecutableWithExports(pcVar1), !bVar2)) {
        return;
      }
    }
    else if (pcVar1 == (cmGeneratorTarget *)0x0) {
      return;
    }
    AddTargetDepend(this,depender_index,pcVar1,linking);
    return;
  }
  pcVar1 = (this->Targets).
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_start[depender_index];
  TVar3 = cmGeneratorTarget::GetType(pcVar1);
  if (TVar3 == GLOBAL_TARGET) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0046(pcVar1);
  if (PVar4 - NEW < 3) {
    t = FATAL_ERROR;
  }
  else {
    if (PVar4 != WARN) goto LAB_00417125;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x2e,id);
    poVar5 = std::operator<<((ostream *)&e,(string *)&local_1e0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&local_1e0);
    t = AUTHOR_WARNING;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  poVar5 = std::operator<<((ostream *)&e,"The dependency target \"");
  poVar5 = std::operator<<(poVar5,(string *)dependee_name);
  poVar5 = std::operator<<(poVar5,"\" of target \"");
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::operator<<(poVar5,"\" does not exist.");
  backtrace = cmGeneratorTarget::GetUtilityBacktrace(pcVar1,&dependee_name->super_string);
  if (backtrace == (cmListFileBacktrace *)0x0) {
    std::__cxx11::stringbuf::str();
    cmListFileBacktrace::cmListFileBacktrace(&local_1c0);
    cmake::IssueMessage(this_00,t,&local_1e0,&local_1c0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
  }
  else {
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,t,&local_1e0,backtrace);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
LAB_00417125:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(int depender_index,
                                             cmLinkItem const& dependee_name,
                                             bool linking)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmGeneratorTarget const* dependee = dependee_name.Target;

  if (!dependee && !linking &&
      (depender->GetType() != cmStateEnums::GLOBAL_TARGET)) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (depender->GetPolicyStatusCMP0046()) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" << dependee_name << "\" of target \""
        << depender->GetName() << "\" does not exist.";

      cmListFileBacktrace const* backtrace =
        depender->GetUtilityBacktrace(dependee_name);
      if (backtrace) {
        cm->IssueMessage(messageType, e.str(), *backtrace);
      } else {
        cm->IssueMessage(messageType, e.str());
      }
    }
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (linking && dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = CM_NULLPTR;
  }

  if (dependee) {
    this->AddTargetDepend(depender_index, dependee, linking);
  }
}